

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_suite.cpp
# Opt level: O0

void enum_suite::to_enum(void)

{
  basic_variable<std::allocator<char>_> *this;
  undefined4 local_54 [6];
  enumeration local_3c;
  undefined1 local_38 [4];
  enumeration result;
  variable input;
  
  this = (basic_variable<std::allocator<char>_> *)local_38;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(this,0x2a);
  local_3c = trial::dynamic::convert::
             into<enum_suite::enumeration,trial::dynamic::basic_variable<std::allocator<char>>>
                       (this);
  local_54[0] = 0x2a;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,enum_suite::enumeration,enum_suite::enumeration>
            ("result","alpha",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/enum_suite.cpp"
             ,0x2f,"void enum_suite::to_enum()",&local_3c,local_54,this,local_3c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void to_enum()
{
    variable input = underlying_type{alpha};
    auto result = convert::into<enumeration>(input);
    TRIAL_PROTOCOL_TEST_EQUAL(result, alpha);
}